

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void operator_suite::addition_assignment(void)

{
  reference piVar1;
  ulong uVar2;
  initializer_list<int> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  undefined4 local_64;
  basic_iterator<int> local_60;
  circular_view<int,_18446744073709551615UL> local_50;
  long local_30;
  type local_28 [6];
  
  local_50.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_60.parent = (view_pointer)0x160000000b;
  local_60.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_60;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  local_60.current = local_50.member.cap * 2;
  if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
    local_60.current = local_60.current - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    local_60.current = (local_50.member.next - local_50.member.size) % local_60.current;
  }
  local_60.parent = &local_50;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_60,0);
  uVar2 = local_50.member.cap * 2;
  if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
  }
  else {
    uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
  }
  if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
    local_30 = local_60.current - uVar2;
    local_64 = 0;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
              ("std::distance(span.begin(), where)","0",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
               ,0x33b,"void operator_suite::addition_assignment()",&local_30,&local_64);
    local_60.current = local_50.member.cap * 2;
    if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
      local_60.current = local_60.current - 1 & local_50.member.next - local_50.member.size;
    }
    else {
      local_60.current = (local_50.member.next - local_50.member.size) % local_60.current;
    }
    local_60.parent = &local_50;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_60,1);
    uVar2 = local_50.member.cap * 2;
    if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
      uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
    }
    else {
      uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
    }
    if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
      local_30 = local_60.current - uVar2;
      local_64 = 1;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                ("std::distance(span.begin(), where)","1",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                 ,0x33e,"void operator_suite::addition_assignment()",&local_30,&local_64);
      local_60.current = local_50.member.cap * 2;
      if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
        local_60.current = local_60.current - 1 & local_50.member.next - local_50.member.size;
      }
      else {
        local_60.current = (local_50.member.next - local_50.member.size) % local_60.current;
      }
      local_60.parent = &local_50;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
                (&local_60,2);
      uVar2 = local_50.member.cap * 2;
      if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
        uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
      }
      else {
        uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
      }
      if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
        local_30 = local_60.current - uVar2;
        local_64 = 2;
        boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                  ("std::distance(span.begin(), where)","2",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                   ,0x341,"void operator_suite::addition_assignment()",&local_30,&local_64);
        local_60.current = local_50.member.cap * 2;
        if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
          local_60.current = local_60.current - 1 & local_50.member.next - local_50.member.size;
        }
        else {
          local_60.current = (local_50.member.next - local_50.member.size) % local_60.current;
        }
        local_60.parent = &local_50;
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
                  (&local_60,3);
        uVar2 = local_50.member.cap * 2;
        if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
          uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
        }
        else {
          uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
        }
        if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
          local_30 = local_60.current - uVar2;
          local_64 = 3;
          boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                    ("std::distance(span.begin(), where)","3",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                     ,0x344,"void operator_suite::addition_assignment()",&local_30,&local_64);
          vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
          piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
          *piVar1 = 0x37;
          local_60.current = local_50.member.cap * 2;
          if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
            local_60.current = local_60.current - 1 & local_50.member.next - local_50.member.size;
          }
          else {
            local_60.current = (local_50.member.next - local_50.member.size) % local_60.current;
          }
          local_60.parent = &local_50;
          vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
                    (&local_60,0);
          uVar2 = local_50.member.cap * 2;
          if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
            uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
          }
          else {
            uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
          }
          if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
            local_30 = local_60.current - uVar2;
            local_64 = 0;
            boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                      ("std::distance(span.begin(), where)","0",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                       ,0x34a,"void operator_suite::addition_assignment()",&local_30,&local_64);
            local_60.current = local_50.member.cap * 2;
            if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
              local_60.current = local_60.current - 1 & local_50.member.next - local_50.member.size;
            }
            else {
              local_60.current = (local_50.member.next - local_50.member.size) % local_60.current;
            }
            local_60.parent = &local_50;
            vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
                      (&local_60,1);
            uVar2 = local_50.member.cap * 2;
            if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
              uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
            }
            else {
              uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
            }
            if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
              local_30 = local_60.current - uVar2;
              local_64 = 1;
              boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                        ("std::distance(span.begin(), where)","1",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                         ,0x34d,"void operator_suite::addition_assignment()",&local_30,&local_64);
              local_60.current = local_50.member.cap * 2;
              if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                local_60.current =
                     local_60.current - 1 & local_50.member.next - local_50.member.size;
              }
              else {
                local_60.current = (local_50.member.next - local_50.member.size) % local_60.current;
              }
              local_60.parent = &local_50;
              vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
                        (&local_60,2);
              uVar2 = local_50.member.cap * 2;
              if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
              }
              else {
                uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
              }
              if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
                local_30 = local_60.current - uVar2;
                local_64 = 2;
                boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                          ("std::distance(span.begin(), where)","2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                           ,0x350,"void operator_suite::addition_assignment()",&local_30,&local_64);
                local_60.current = local_50.member.cap * 2;
                if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                  local_60.current =
                       local_60.current - 1 & local_50.member.next - local_50.member.size;
                }
                else {
                  local_60.current =
                       (local_50.member.next - local_50.member.size) % local_60.current;
                }
                local_60.parent = &local_50;
                vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
                          (&local_60,3);
                uVar2 = local_50.member.cap * 2;
                if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                  uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                }
                else {
                  uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                }
                if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
                  local_30 = local_60.current - uVar2;
                  local_64 = 3;
                  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                            ("std::distance(span.begin(), where)","3",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                             ,0x353,"void operator_suite::addition_assignment()",&local_30,&local_64
                            );
                  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
                  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
                  *piVar1 = 0x42;
                  local_60.current = local_50.member.cap * 2;
                  if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                    local_60.current =
                         local_60.current - 1 & local_50.member.next - local_50.member.size;
                  }
                  else {
                    local_60.current =
                         (local_50.member.next - local_50.member.size) % local_60.current;
                  }
                  local_60.parent = &local_50;
                  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
                            (&local_60,0);
                  uVar2 = local_50.member.cap * 2;
                  if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                    uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                  }
                  else {
                    uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                  }
                  if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
                    local_30 = local_60.current - uVar2;
                    local_64 = 0;
                    boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                              ("std::distance(span.begin(), where)","0",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                               ,0x359,"void operator_suite::addition_assignment()",&local_30,
                               &local_64);
                    local_60.current = local_50.member.cap * 2;
                    if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                      local_60.current =
                           local_60.current - 1 & local_50.member.next - local_50.member.size;
                    }
                    else {
                      local_60.current =
                           (local_50.member.next - local_50.member.size) % local_60.current;
                    }
                    local_60.parent = &local_50;
                    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::
                    operator+=(&local_60,1);
                    uVar2 = local_50.member.cap * 2;
                    if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                      uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                    }
                    else {
                      uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                    }
                    if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
                      local_30 = local_60.current - uVar2;
                      local_64 = 1;
                      boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                                ("std::distance(span.begin(), where)","1",
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                 ,0x35c,"void operator_suite::addition_assignment()",&local_30,
                                 &local_64);
                      local_60.current = local_50.member.cap * 2;
                      if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                        local_60.current =
                             local_60.current - 1 & local_50.member.next - local_50.member.size;
                      }
                      else {
                        local_60.current =
                             (local_50.member.next - local_50.member.size) % local_60.current;
                      }
                      local_60.parent = &local_50;
                      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::
                      operator+=(&local_60,2);
                      uVar2 = local_50.member.cap * 2;
                      if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                        uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                      }
                      else {
                        uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                      }
                      if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
                        local_30 = local_60.current - uVar2;
                        local_64 = 2;
                        boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                                  ("std::distance(span.begin(), where)","2",
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                   ,0x35f,"void operator_suite::addition_assignment()",&local_30,
                                   &local_64);
                        local_60.current = local_50.member.cap * 2;
                        if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                          local_60.current =
                               local_60.current - 1 & local_50.member.next - local_50.member.size;
                        }
                        else {
                          local_60.current =
                               (local_50.member.next - local_50.member.size) % local_60.current;
                        }
                        local_60.parent = &local_50;
                        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::
                        operator+=(&local_60,3);
                        uVar2 = local_50.member.cap * 2;
                        if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                          uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                        }
                        else {
                          uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                        }
                        if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
                          local_30 = local_60.current - uVar2;
                          local_64 = 3;
                          boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                                    ("std::distance(span.begin(), where)","3",
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                     ,0x362,"void operator_suite::addition_assignment()",&local_30,
                                     &local_64);
                          vista::circular_view<int,_18446744073709551615UL>::expand_back
                                    (&local_50,1);
                          piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                                             (&local_50);
                          *piVar1 = 0x4d;
                          local_60.current = local_50.member.cap * 2;
                          if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                            local_60.current =
                                 local_60.current - 1 & local_50.member.next - local_50.member.size;
                          }
                          else {
                            local_60.current =
                                 (local_50.member.next - local_50.member.size) % local_60.current;
                          }
                          local_60.parent = &local_50;
                          vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::
                          operator+=(&local_60,0);
                          uVar2 = local_50.member.cap * 2;
                          if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                            uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                          }
                          else {
                            uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                          }
                          if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0)
                          {
                            local_30 = local_60.current - uVar2;
                            local_64 = 0;
                            boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                                      ("std::distance(span.begin(), where)","0",
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                       ,0x368,"void operator_suite::addition_assignment()",&local_30
                                       ,&local_64);
                            local_60.current = local_50.member.cap * 2;
                            if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                              local_60.current =
                                   local_60.current - 1 &
                                   local_50.member.next - local_50.member.size;
                            }
                            else {
                              local_60.current =
                                   (local_50.member.next - local_50.member.size) % local_60.current;
                            }
                            local_60.parent = &local_50;
                            vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::
                            operator+=(&local_60,1);
                            uVar2 = local_50.member.cap * 2;
                            if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                              uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                            }
                            else {
                              uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                            }
                            if (local_60.parent != (circular_view<int,_18446744073709551615UL> *)0x0
                               ) {
                              local_30 = local_60.current - uVar2;
                              local_64 = 1;
                              boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                                        ("std::distance(span.begin(), where)","1",
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                         ,0x36b,"void operator_suite::addition_assignment()",
                                         &local_30,&local_64);
                              local_60.current = local_50.member.cap * 2;
                              if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                                local_60.current =
                                     local_60.current - 1 &
                                     local_50.member.next - local_50.member.size;
                              }
                              else {
                                local_60.current =
                                     (local_50.member.next - local_50.member.size) %
                                     local_60.current;
                              }
                              local_60.parent = &local_50;
                              vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>
                              ::operator+=(&local_60,2);
                              uVar2 = local_50.member.cap * 2;
                              if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                                uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                              }
                              else {
                                uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                              }
                              if (local_60.parent !=
                                  (circular_view<int,_18446744073709551615UL> *)0x0) {
                                local_30 = local_60.current - uVar2;
                                local_64 = 2;
                                boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                                          ("std::distance(span.begin(), where)","2",
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                           ,0x36e,"void operator_suite::addition_assignment()",
                                           &local_30,&local_64);
                                local_60.current = local_50.member.cap * 2;
                                if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                                  local_60.current =
                                       local_60.current - 1 &
                                       local_50.member.next - local_50.member.size;
                                }
                                else {
                                  local_60.current =
                                       (local_50.member.next - local_50.member.size) %
                                       local_60.current;
                                }
                                local_60.parent = &local_50;
                                vista::circular_view<int,_18446744073709551615UL>::
                                basic_iterator<int>::operator+=(&local_60,3);
                                uVar2 = local_50.member.cap * 2;
                                if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                                  uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                                }
                                else {
                                  uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                                }
                                if (local_60.parent !=
                                    (circular_view<int,_18446744073709551615UL> *)0x0) {
                                  local_30 = local_60.current - uVar2;
                                  local_64 = 3;
                                  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
                                            ("std::distance(span.begin(), where)","3",
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                             ,0x371,"void operator_suite::addition_assignment()",
                                             &local_30,&local_64);
                                  vista::circular_view<int,_18446744073709551615UL>::expand_back
                                            (&local_50,1);
                                  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                                                     (&local_50);
                                  *piVar1 = 0x58;
                                  local_60.current = local_50.member.cap * 2;
                                  if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                                    local_60.current =
                                         local_60.current - 1 &
                                         local_50.member.next - local_50.member.size;
                                  }
                                  else {
                                    local_60.current =
                                         (local_50.member.next - local_50.member.size) %
                                         local_60.current;
                                  }
                                  local_60.parent = &local_50;
                                  vista::circular_view<int,_18446744073709551615UL>::
                                  basic_iterator<int>::operator+=(&local_60,0);
                                  uVar2 = local_50.member.cap * 2;
                                  if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                                    uVar2 = uVar2 - 1 & local_50.member.next - local_50.member.size;
                                  }
                                  else {
                                    uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                                  }
                                  if (local_60.parent !=
                                      (circular_view<int,_18446744073709551615UL> *)0x0) {
                                    local_30 = local_60.current - uVar2;
                                    local_64 = 0;
                                    boost::detail::
                                    test_with_impl<boost::detail::lw_test_eq,long,int>
                                              ("std::distance(span.begin(), where)","0",
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                               ,0x377,"void operator_suite::addition_assignment()",
                                               &local_30,&local_64);
                                    local_60.current = local_50.member.cap * 2;
                                    if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                                      local_60.current =
                                           local_60.current - 1 &
                                           local_50.member.next - local_50.member.size;
                                    }
                                    else {
                                      local_60.current =
                                           (local_50.member.next - local_50.member.size) %
                                           local_60.current;
                                    }
                                    local_60.parent = &local_50;
                                    vista::circular_view<int,_18446744073709551615UL>::
                                    basic_iterator<int>::operator+=(&local_60,1);
                                    uVar2 = local_50.member.cap * 2;
                                    if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                                      uVar2 = uVar2 - 1 &
                                              local_50.member.next - local_50.member.size;
                                    }
                                    else {
                                      uVar2 = (local_50.member.next - local_50.member.size) % uVar2;
                                    }
                                    if (local_60.parent !=
                                        (circular_view<int,_18446744073709551615UL> *)0x0) {
                                      local_30 = local_60.current - uVar2;
                                      local_64 = 1;
                                      boost::detail::
                                      test_with_impl<boost::detail::lw_test_eq,long,int>
                                                ("std::distance(span.begin(), where)","1",
                                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                                 ,0x37a,"void operator_suite::addition_assignment()"
                                                 ,&local_30,&local_64);
                                      local_60.current = local_50.member.cap * 2;
                                      if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                                        local_60.current =
                                             local_60.current - 1 &
                                             local_50.member.next - local_50.member.size;
                                      }
                                      else {
                                        local_60.current =
                                             (local_50.member.next - local_50.member.size) %
                                             local_60.current;
                                      }
                                      local_60.parent = &local_50;
                                      vista::circular_view<int,_18446744073709551615UL>::
                                      basic_iterator<int>::operator+=(&local_60,2);
                                      uVar2 = local_50.member.cap * 2;
                                      if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                                        uVar2 = uVar2 - 1 &
                                                local_50.member.next - local_50.member.size;
                                      }
                                      else {
                                        uVar2 = (local_50.member.next - local_50.member.size) %
                                                uVar2;
                                      }
                                      if (local_60.parent !=
                                          (circular_view<int,_18446744073709551615UL> *)0x0) {
                                        local_30 = local_60.current - uVar2;
                                        local_64 = 2;
                                        boost::detail::
                                        test_with_impl<boost::detail::lw_test_eq,long,int>
                                                  ("std::distance(span.begin(), where)","2",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                                  ,0x37d,
                                                  "void operator_suite::addition_assignment()",
                                                  &local_30,&local_64);
                                        local_60.current = local_50.member.cap * 2;
                                        if ((local_60.current & local_50.member.cap * 2 - 1) == 0) {
                                          local_60.current =
                                               local_60.current - 1 &
                                               local_50.member.next - local_50.member.size;
                                        }
                                        else {
                                          local_60.current =
                                               (local_50.member.next - local_50.member.size) %
                                               local_60.current;
                                        }
                                        local_60.parent = &local_50;
                                        vista::circular_view<int,_18446744073709551615UL>::
                                        basic_iterator<int>::operator+=(&local_60,3);
                                        uVar2 = local_50.member.cap * 2;
                                        if ((uVar2 & local_50.member.cap * 2 - 1) == 0) {
                                          uVar2 = uVar2 - 1 &
                                                  local_50.member.next - local_50.member.size;
                                        }
                                        else {
                                          uVar2 = (local_50.member.next - local_50.member.size) %
                                                  uVar2;
                                        }
                                        if (local_60.parent !=
                                            (circular_view<int,_18446744073709551615UL> *)0x0) {
                                          local_30 = local_60.current - uVar2;
                                          local_64 = 3;
                                          boost::detail::
                                          test_with_impl<boost::detail::lw_test_eq,long,int>
                                                    ("std::distance(span.begin(), where)","3",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
                                                  ,0x380,
                                                  "void operator_suite::addition_assignment()",
                                                  &local_30,&local_64);
                                          return;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("parent",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x398,
                "difference_type vista::circular_view<int>::basic_iterator<int>::operator-(const iterator_type &) const [T = int, Extent = 18446744073709551615, U = int]"
               );
}

Assistant:

void addition_assignment()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(55);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(66);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(77);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(88);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
}